

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O1

void opj_copy_image_header(opj_image_t *p_image_src,opj_image_t *p_image_dest)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  void *ptr;
  opj_image_comp_t *poVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  opj_image_comp_t *poVar12;
  OPJ_BYTE *__dest;
  ulong uVar13;
  long lVar14;
  
  if (p_image_src == (opj_image_t *)0x0) {
    __assert_fail("p_image_src != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/image.c"
                  ,0xab,"void opj_copy_image_header(const opj_image_t *, opj_image_t *)");
  }
  if (p_image_dest != (opj_image_t *)0x0) {
    p_image_dest->x0 = p_image_src->x0;
    p_image_dest->y0 = p_image_src->y0;
    p_image_dest->x1 = p_image_src->x1;
    p_image_dest->y1 = p_image_src->y1;
    if (p_image_dest->comps != (opj_image_comp_t *)0x0) {
      if (p_image_dest->numcomps != 0) {
        lVar14 = 0x30;
        uVar13 = 0;
        do {
          ptr = *(void **)((long)&p_image_dest->comps->dx + lVar14);
          if (ptr != (void *)0x0) {
            opj_image_data_free(ptr);
          }
          uVar13 = uVar13 + 1;
          lVar14 = lVar14 + 0x40;
        } while (uVar13 < p_image_dest->numcomps);
      }
      opj_free(p_image_dest->comps);
      p_image_dest->comps = (opj_image_comp_t *)0x0;
    }
    uVar3 = p_image_src->numcomps;
    p_image_dest->numcomps = uVar3;
    poVar12 = (opj_image_comp_t *)opj_malloc((ulong)uVar3 << 6);
    p_image_dest->comps = poVar12;
    if (poVar12 == (opj_image_comp_t *)0x0) {
      p_image_dest->comps = (opj_image_comp_t *)0x0;
      p_image_dest->numcomps = 0;
    }
    else {
      if (p_image_dest->numcomps != 0) {
        lVar14 = 0;
        uVar13 = 0;
        do {
          poVar12 = p_image_dest->comps;
          poVar4 = p_image_src->comps;
          puVar1 = (undefined8 *)((long)&poVar4->dx + lVar14);
          uVar5 = *puVar1;
          uVar6 = puVar1[1];
          puVar1 = (undefined8 *)((long)&poVar4->x0 + lVar14);
          uVar7 = *puVar1;
          uVar8 = puVar1[1];
          puVar1 = (undefined8 *)((long)&poVar4->sgnd + lVar14);
          uVar9 = *puVar1;
          uVar10 = puVar1[1];
          puVar1 = (undefined8 *)((long)&poVar4->data + lVar14);
          uVar11 = puVar1[1];
          puVar2 = (undefined8 *)((long)&poVar12->data + lVar14);
          *puVar2 = *puVar1;
          puVar2[1] = uVar11;
          puVar1 = (undefined8 *)((long)&poVar12->sgnd + lVar14);
          *puVar1 = uVar9;
          puVar1[1] = uVar10;
          puVar1 = (undefined8 *)((long)&poVar12->x0 + lVar14);
          *puVar1 = uVar7;
          puVar1[1] = uVar8;
          puVar1 = (undefined8 *)((long)&poVar12->dx + lVar14);
          *puVar1 = uVar5;
          puVar1[1] = uVar6;
          *(undefined8 *)((long)&p_image_dest->comps->data + lVar14) = 0;
          uVar13 = uVar13 + 1;
          lVar14 = lVar14 + 0x40;
        } while (uVar13 < p_image_dest->numcomps);
      }
      p_image_dest->color_space = p_image_src->color_space;
      uVar3 = p_image_src->icc_profile_len;
      p_image_dest->icc_profile_len = uVar3;
      if ((ulong)uVar3 == 0) {
        p_image_dest->icc_profile_buf = (OPJ_BYTE *)0x0;
      }
      else {
        __dest = (OPJ_BYTE *)opj_malloc((ulong)uVar3);
        p_image_dest->icc_profile_buf = __dest;
        if (__dest != (OPJ_BYTE *)0x0) {
          memcpy(__dest,p_image_src->icc_profile_buf,(ulong)p_image_src->icc_profile_len);
          return;
        }
        p_image_dest->icc_profile_buf = (OPJ_BYTE *)0x0;
        p_image_dest->icc_profile_len = 0;
      }
    }
    return;
  }
  __assert_fail("p_image_dest != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/image.c"
                ,0xac,"void opj_copy_image_header(const opj_image_t *, opj_image_t *)");
}

Assistant:

void opj_copy_image_header(const opj_image_t* p_image_src,
                           opj_image_t* p_image_dest)
{
    OPJ_UINT32 compno;

    /* preconditions */
    assert(p_image_src != 00);
    assert(p_image_dest != 00);

    p_image_dest->x0 = p_image_src->x0;
    p_image_dest->y0 = p_image_src->y0;
    p_image_dest->x1 = p_image_src->x1;
    p_image_dest->y1 = p_image_src->y1;

    if (p_image_dest->comps) {
        for (compno = 0; compno < p_image_dest->numcomps; compno++) {
            opj_image_comp_t *image_comp = &(p_image_dest->comps[compno]);
            if (image_comp->data) {
                opj_image_data_free(image_comp->data);
            }
        }
        opj_free(p_image_dest->comps);
        p_image_dest->comps = NULL;
    }

    p_image_dest->numcomps = p_image_src->numcomps;

    p_image_dest->comps = (opj_image_comp_t*) opj_malloc(p_image_dest->numcomps *
                          sizeof(opj_image_comp_t));
    if (!p_image_dest->comps) {
        p_image_dest->comps = NULL;
        p_image_dest->numcomps = 0;
        return;
    }

    for (compno = 0; compno < p_image_dest->numcomps; compno++) {
        memcpy(&(p_image_dest->comps[compno]),
               &(p_image_src->comps[compno]),
               sizeof(opj_image_comp_t));
        p_image_dest->comps[compno].data = NULL;
    }

    p_image_dest->color_space = p_image_src->color_space;
    p_image_dest->icc_profile_len = p_image_src->icc_profile_len;

    if (p_image_dest->icc_profile_len) {
        p_image_dest->icc_profile_buf = (OPJ_BYTE*)opj_malloc(
                                            p_image_dest->icc_profile_len);
        if (!p_image_dest->icc_profile_buf) {
            p_image_dest->icc_profile_buf = NULL;
            p_image_dest->icc_profile_len = 0;
            return;
        }
        memcpy(p_image_dest->icc_profile_buf,
               p_image_src->icc_profile_buf,
               p_image_src->icc_profile_len);
    } else {
        p_image_dest->icc_profile_buf = NULL;
    }

    return;
}